

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.hh
# Opt level: O1

void __thiscall ActionDirectWrite::ActionDirectWrite(ActionDirectWrite *this,string *g,bool prop)

{
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"directwrite","");
  Action::Action(&this->super_Action,0,&local_48,g);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (this->super_Action)._vptr_Action = (_func_int **)&PTR__Action_003c8150;
  this->propagateIndirect = prop;
  return;
}

Assistant:

ActionDirectWrite(const string &g,bool prop) : Action(0,"directwrite",g) { propagateIndirect=prop; }